

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O2

CBString * getAbsPath(CBString *__return_storage_ptr__,CBString *path)

{
  char *s;
  CBString local_30;
  
  s = realpath((char *)(path->super_tagbstring).data,(char *)0x0);
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  if (s == (char *)0x0) {
    Bstrlib::CBString::operator=(__return_storage_ptr__,path);
  }
  else {
    Bstrlib::CBString::CBString(&local_30,s);
    Bstrlib::CBString::operator=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  free(s);
  return __return_storage_ptr__;
}

Assistant:

UString getAbsPath(const UString & path) {
    char * abs = realpath(path.toLocal8Bit(), nullptr);
    // Last is a non-standard extension for non-existent files
    UString new_path;
    if (abs)
        new_path = UString(abs);
    else
        new_path = path;
    free(abs);
    return new_path;
}